

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O2

void __thiscall
HighsCliqueTable::cliquePartition
          (HighsCliqueTable *this,vector<double,_std::allocator<double>_> *objective,
          vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *clqVars
          ,vector<int,_std::allocator<int>_> *partitionStart)

{
  int64_t *numQueries;
  CliqueVar *pCVar1;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  _Var2;
  pointer piVar3;
  pointer pCVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  HighsInt HVar8;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  _Var9;
  ulong uVar10;
  ulong uVar11;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  _Var12;
  ulong uVar13;
  int local_70;
  HighsInt numClqVars;
  vector<int,_std::allocator<int>_> *local_68;
  HighsCliqueTable *local_60;
  vector<int,_std::allocator<int>_> neighbourhoodInds;
  
  pCVar1 = (clqVars->
           super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_60 = this;
  HighsRandom::shuffle<HighsCliqueTable::CliqueVar>
            (&this->randgen,pCVar1,
             (HighsInt)
             ((ulong)((long)(clqVars->
                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) >> 2));
  _Var9._M_current =
       (clqVars->
       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
       )._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_current =
       (clqVars->
       super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  _Var12._M_current = _Var9._M_current;
  if (_Var9._M_current != _Var2._M_current) {
    iVar5 = pdqsort_detail::log2<long>((long)_Var2._M_current - (long)_Var9._M_current >> 2);
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::cliquePartition(std::vector<double,std::allocator<double>>const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,std::vector<int,std::allocator<int>>&)::__0,true>
              (_Var9,_Var2,(anon_class_8_1_bccf3fd9)objective,iVar5,true);
    _Var9._M_current =
         (clqVars->
         super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    _Var12._M_current =
         (clqVars->
         super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
         )._M_impl.super__Vector_impl_data._M_start;
  }
  neighbourhoodInds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  neighbourhoodInds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  neighbourhoodInds.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            (&neighbourhoodInds,(long)_Var9._M_current - (long)_Var12._M_current >> 2);
  uVar11 = (long)(clqVars->
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(clqVars->
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 2;
  iVar5 = (int)uVar11;
  piVar3 = (partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish != piVar3) {
    (partitionStart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar3;
  }
  numClqVars = iVar5;
  std::vector<int,_std::allocator<int>_>::reserve(partitionStart,uVar11);
  local_70 = 0;
  local_68 = partitionStart;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(partitionStart,&local_70);
  numQueries = &local_60->numNeighbourhoodQueries;
  uVar11 = uVar11 & 0xffffffff;
  uVar13 = 0;
  for (local_70 = 0; local_70 < iVar5; local_70 = local_70 + 1) {
    uVar10 = uVar13;
    iVar7 = (int)uVar11;
    if (local_70 == (int)uVar11) {
      std::vector<int,_std::allocator<int>_>::push_back(local_68,&local_70);
      uVar10 = 0;
      iVar7 = iVar5;
      if (local_70 <= (int)uVar13) {
        pCVar4 = (clqVars->
                 super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        _Var2._M_current = pCVar4 + local_70;
        _Var9._M_current = pCVar4 + uVar13 + 1;
        if (_Var2._M_current != _Var9._M_current) {
          iVar6 = pdqsort_detail::log2<long>((long)_Var9._M_current - (long)_Var2._M_current >> 2);
          pdqsort_detail::
          pdqsort_loop<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::cliquePartition(std::vector<double,std::allocator<double>>const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,std::vector<int,std::allocator<int>>&)::__1,true>
                    (_Var2,_Var9,(anon_class_8_1_bccf3fd9)objective,iVar6,true);
        }
      }
    }
    pCVar1 = (clqVars->
             super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             )._M_impl.super__Vector_impl_data._M_start + local_70;
    iVar6 = local_70 + 1;
    HVar8 = partitionNeighbourhood
                      (local_60,&neighbourhoodInds,numQueries,*pCVar1,pCVar1 + 1,iVar7 - iVar6);
    if ((neighbourhoodInds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start !=
         neighbourhoodInds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       ((int)uVar10 <
        neighbourhoodInds.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish[-1] + iVar6)) {
      uVar10 = (ulong)(uint)(neighbourhoodInds.super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_finish[-1] + iVar6);
    }
    uVar11 = (ulong)(uint)(HVar8 + iVar6);
    uVar13 = uVar10;
  }
  std::vector<int,_std::allocator<int>_>::push_back(local_68,&numClqVars);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&neighbourhoodInds.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void HighsCliqueTable::cliquePartition(const std::vector<double>& objective,
                                       std::vector<CliqueVar>& clqVars,
                                       std::vector<HighsInt>& partitionStart) {
  randgen.shuffle(clqVars.data(), clqVars.size());

  pdqsort_branchless(clqVars.begin(), clqVars.end(),
                     [&](CliqueVar v1, CliqueVar v2) {
                       return (2 * v1.val - 1) * objective[v1.col] >
                              (2 * v2.val - 1) * objective[v2.col];
                     });

  std::vector<HighsInt> neighbourhoodInds;
  neighbourhoodInds.reserve(clqVars.size());

  HighsInt numClqVars = clqVars.size();
  partitionStart.clear();
  partitionStart.reserve(clqVars.size());
  HighsInt extensionEnd = numClqVars;
  partitionStart.push_back(0);
  HighsInt lastSwappedIndex = 0;
  for (HighsInt i = 0; i < numClqVars; ++i) {
    if (i == extensionEnd) {
      partitionStart.push_back(i);
      extensionEnd = numClqVars;
      if (lastSwappedIndex >= i)
        pdqsort_branchless(clqVars.begin() + i,
                           clqVars.begin() + lastSwappedIndex + 1,
                           [&](CliqueVar v1, CliqueVar v2) {
                             return (2 * v1.val - 1) * objective[v1.col] >
                                    (2 * v2.val - 1) * objective[v2.col];
                           });
      lastSwappedIndex = 0;
    }
    CliqueVar v = clqVars[i];
    HighsInt extensionStart = i + 1;
    extensionEnd =
        partitionNeighbourhood(neighbourhoodInds, numNeighbourhoodQueries, v,
                               clqVars.data() + extensionStart,
                               extensionEnd - extensionStart) +
        extensionStart;
    if (!neighbourhoodInds.empty())
      lastSwappedIndex =
          std::max(neighbourhoodInds.back() + extensionStart, lastSwappedIndex);
  }

  partitionStart.push_back(numClqVars);
}